

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnownFormats.h
# Opt level: O0

Item * __thiscall
jbcoin::KnownFormats<jbcoin::TxType>::findByName(KnownFormats<jbcoin::TxType> *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator iter;
  Item *result;
  string *name_local;
  KnownFormats<jbcoin::TxType> *this_local;
  
  iter._M_node = (_Base_ptr)0x0;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*>_>_>
       ::find(&this->m_names,name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*>_>_>
       ::end(&this->m_names);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::TxType>::Item_*>_>
             ::operator->(&local_28);
    iter._M_node = (_Base_ptr)ppVar2->second;
  }
  return (Item *)iter._M_node;
}

Assistant:

Item const* findByName (std::string const& name) const noexcept
    {
        Item* result = nullptr;

        typename NameMap::const_iterator const iter = m_names.find (name);

        if (iter != m_names.end ())
        {
            result = iter->second;
        }

        return result;
    }